

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_init_encoder_lzma(archive *a,la_zstream_conflict *lastrm,int level)

{
  char cVar1;
  int iVar2;
  int local_a4;
  undefined1 local_a0 [4];
  int r;
  lzma_options_lzma lzma_opt;
  lzma_stream *strm;
  int level_local;
  la_zstream_conflict *lastrm_local;
  archive *a_local;
  
  if (lastrm->valid != 0) {
    compression_end(a,lastrm);
  }
  cVar1 = lzma_lzma_preset(local_a0,level);
  if (cVar1 == '\0') {
    lzma_opt.reserved_ptr2 = calloc(1,0x88);
    if (lzma_opt.reserved_ptr2 == (void *)0x0) {
      archive_set_error(a,0xc,"Can\'t allocate memory for lzma stream");
      a_local._4_4_ = -0x1e;
    }
    else {
      memcpy(lzma_opt.reserved_ptr2,&compression_init_encoder_lzma::lzma_init_data,0x88);
      iVar2 = lzma_alone_encoder(lzma_opt.reserved_ptr2,local_a0);
      if (iVar2 == 0) {
        lastrm->real_stream = lzma_opt.reserved_ptr2;
        lastrm->valid = 1;
        lastrm->code = compression_code_lzma;
        lastrm->end = compression_end_lzma;
        local_a4 = 0;
      }
      else if (iVar2 == 5) {
        free(lzma_opt.reserved_ptr2);
        lastrm->real_stream = (void *)0x0;
        archive_set_error(a,0xc,
                          "Internal error initializing compression library: Cannot allocate memory")
        ;
        local_a4 = -0x1e;
      }
      else {
        free(lzma_opt.reserved_ptr2);
        lastrm->real_stream = (void *)0x0;
        archive_set_error(a,-1,
                          "Internal error initializing compression library: It\'s a bug in liblzma")
        ;
        local_a4 = -0x1e;
      }
      a_local._4_4_ = local_a4;
    }
  }
  else {
    lastrm->real_stream = (void *)0x0;
    archive_set_error(a,0xc,"Internal error initializing compression library");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_init_encoder_lzma(struct archive *a,
    struct la_zstream *lastrm, int level, uint64_t filter_id)
{
	static const lzma_stream lzma_init_data = LZMA_STREAM_INIT;
	lzma_stream *strm;
	lzma_filter *lzmafilters;
	lzma_options_lzma lzma_opt;
	int r;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm) + sizeof(*lzmafilters) * 2);
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for lzma stream");
		return (ARCHIVE_FATAL);
	}
	lzmafilters = (lzma_filter *)(strm+1);
	if (level > 9)
		level = 9;
	if (lzma_lzma_preset(&lzma_opt, level)) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lzmafilters[0].id = filter_id;
	lzmafilters[0].options = &lzma_opt;
	lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */

	r = lzma_properties_size(&(lastrm->prop_size), lzmafilters);
	if (r != LZMA_OK) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "lzma_properties_size failed");
		return (ARCHIVE_FATAL);
	}
	if (lastrm->prop_size) {
		lastrm->props = malloc(lastrm->prop_size);
		if (lastrm->props == NULL) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ENOMEM,
			    "Cannot allocate memory");
			return (ARCHIVE_FATAL);
		}
		r = lzma_properties_encode(lzmafilters,  lastrm->props);
		if (r != LZMA_OK) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "lzma_properties_encode failed");
			return (ARCHIVE_FATAL);
		}
	}

	*strm = lzma_init_data;
	r = lzma_raw_encoder(strm, lzmafilters);
	switch (r) {
	case LZMA_OK:
		lastrm->real_stream = strm;
		lastrm->valid = 1;
		lastrm->code = compression_code_lzma;
		lastrm->end = compression_end_lzma;
		r = ARCHIVE_OK;
		break;
	case LZMA_MEM_ERROR:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library: "
		    "Cannot allocate memory");
		r =  ARCHIVE_FATAL;
		break;
        default:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "It's a bug in liblzma");
		r =  ARCHIVE_FATAL;
		break;
	}
	return (r);
}